

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3interp.cpp
# Opt level: O0

void __thiscall w3Interp::Shr_s_i64(w3Interp *this)

{
  int64_t iVar1;
  int64_t *piVar2;
  int64_t b;
  w3Interp *this_local;
  
  iVar1 = w3Stack::pop_i64(&this->super_w3Stack);
  piVar2 = w3Stack::i64(&this->super_w3Stack);
  *piVar2 = *piVar2 << ((byte)iVar1 & 0x3f);
  return;
}

Assistant:

INTERP (Shr_s_i64)
{
    const int64_t b = pop_i64 ();
    i64 () <<= (b & 63);
}